

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IVal * __thiscall
deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_2>_>::doEvaluate
          (IVal *__return_storage_ptr__,Variable<tcu::Vector<float,_2>_> *this,EvalContext *ctx)

{
  IVal *v;
  
  v = Environment::lookup<tcu::Vector<float,2>>(ctx->env,this);
  tcu::Vector<tcu::Interval,_2>::Vector(__return_storage_ptr__,v);
  return __return_storage_ptr__;
}

Assistant:

IVal			doEvaluate	(const EvalContext& ctx)		const
	{
		return ctx.env.lookup<T>(*this);
	}